

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O2

char * xc_functional_get_name(int number)

{
  int *piVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  
  pcVar3 = (char *)((long)&PTR_strcasecmp_00fff058 + 4);
  do {
    piVar1 = (int *)(pcVar3 + 0x204);
    if (*piVar1 == -1) {
      return (char *)0x0;
    }
    pcVar3 = pcVar3 + 0x104;
  } while (*piVar1 != number);
  sVar2 = strlen(pcVar3);
  __dest = (char *)malloc(sVar2 + 1);
  pcVar3 = strcpy(__dest,pcVar3);
  return pcVar3;
}

Assistant:

char *xc_functional_get_name(int number)
{
  int ii;
  char *p;

  for(ii=0;;ii++){
    if(xc_functional_keys[ii].number == -1)
      return NULL;
    if(xc_functional_keys[ii].number == number) {
      /* return duplicated: caller has the responsibility to dealloc string.
         Do this the old way since strdup and strndup aren't C standard. */
      p = (char *) libxc_malloc(strlen(xc_functional_keys[ii].name) + 1);
      strcpy(p,xc_functional_keys[ii].name);
      return p;
    }
  }
}